

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O3

void __thiscall Board::populateBoard(Board *this,ifstream *dataFile)

{
  pointer *ppBVar1;
  iterator __position;
  Block block;
  istream *piVar2;
  int id;
  char direction;
  int length;
  int column;
  int row;
  Block tempBlock;
  char local_75;
  int local_74;
  int local_70;
  int local_6c;
  Block local_68;
  vector<Block,std::allocator<Block>> *local_50;
  Block local_44;
  
  Block::Block(&local_68);
  local_50 = (vector<Block,std::allocator<Block>> *)&this->blocks;
  id = 1;
  while( true ) {
    piVar2 = (istream *)std::istream::operator>>((istream *)dataFile,&local_6c);
    piVar2 = (istream *)std::istream::operator>>(piVar2,&local_70);
    piVar2 = (istream *)std::istream::operator>>(piVar2,&local_74);
    piVar2 = std::operator>>(piVar2,&local_75);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    Block::Block(&local_44,id,local_6c + -1,local_70 + -1,local_74,local_75);
    local_68.direction = local_44.direction;
    local_68.id = local_44.id;
    local_68.row = local_44.row;
    local_68.column = local_44.column;
    local_68.length = local_44.length;
    __position._M_current =
         (this->blocks).super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->blocks).super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Block,std::allocator<Block>>::_M_realloc_insert<Block_const&>
                (local_50,__position,&local_68);
    }
    else {
      (__position._M_current)->direction = local_44.direction;
      (__position._M_current)->id = local_44.id;
      (__position._M_current)->row = local_44.row;
      (__position._M_current)->column = local_44.column;
      (__position._M_current)->length = local_44.length;
      ppBVar1 = &(this->blocks).super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppBVar1 = *ppBVar1 + 1;
    }
    block.column = local_68.column;
    block.length = local_68.length;
    block.id = local_68.id;
    block.row = local_68.row;
    block.direction = local_68.direction;
    insert(this,block,-1);
    id = id + 1;
  }
  return;
}

Assistant:

void Board::populateBoard(std::ifstream &dataFile) {
    int row, column, length;
    int id = 1;
    char direction;
    Block tempBlock;

    // Collect the other blocks.
    while (dataFile >> row >> column >> length >> direction) {
        // Construct a temporary block.
        tempBlock = Block(id++, row - 1, column - 1, length, direction);

        // Fill the cells storage variables.
        this->blocks.push_back(tempBlock);
        this->insert(tempBlock);
    }
}